

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonArray::takeAt(QJsonArray *this,qsizetype i)

{
  bool bVar1;
  QCborContainerPrivate *pQVar2;
  qsizetype qVar3;
  QCborContainerPrivate *in_RDX;
  QJsonValue *in_RSI;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  QJsonValue *v;
  QCborValue *in_stack_ffffffffffffff80;
  QCborValue *v_00;
  QJsonValue *pQVar4;
  QCborContainerPrivate *in_stack_ffffffffffffffb0;
  QCborValue local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  bVar1 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4871c7);
  if ((!bVar1) && (-1 < (long)in_RDX)) {
    pQVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4871e7);
    qVar3 = QList<QtCbor::Element>::size(&pQVar2->elements);
    if ((long)in_RDX < qVar3) {
      detach((QJsonArray *)in_RDI,(qsizetype)in_RDX);
      *(undefined1 **)&(in_RDI->value).t = &DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48724e);
      v_00 = &local_20;
      QCborContainerPrivate::extractAt(in_RDX,(qsizetype)v_00);
      QJsonPrivate::Value::fromTrustedCbor(v_00);
      ::QCborValue::~QCborValue(in_stack_ffffffffffffff80);
      QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48728a);
      QCborContainerPrivate::removeAt(in_stack_ffffffffffffffb0,(qsizetype)in_RSI);
      goto LAB_004872ef;
    }
  }
  QJsonValue::QJsonValue(in_RSI,(Type)((ulong)pQVar4 >> 0x20));
LAB_004872ef:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QJsonValue QJsonArray::takeAt(qsizetype i)
{
    if (!a || i < 0 || i >= a->elements.size())
        return QJsonValue(QJsonValue::Undefined);

    detach();
    const QJsonValue v = QJsonPrivate::Value::fromTrustedCbor(a->extractAt(i));
    a->removeAt(i);
    return v;
}